

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_ArgErrors_Test::TestBody(FormatterTest_ArgErrors_Test *this)

{
  bool bVar1;
  int *args;
  char *pcVar2;
  AssertionResult gtest_ar_5;
  AssertHelper local_260;
  AssertionResult gtest_ar;
  char format_str [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)format_str,"invalid format string",(allocator *)&gtest_ar_5);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[2]>(&local_38,(char (*) [2])0x1e5083);
      std::__cxx11::string::~string((string *)&local_38);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [93])
               "Expected: format(\"{\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)format_str);
  }
  testing::Message::Message((Message *)format_str);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x305,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)format_str);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)format_str);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)format_str,"invalid format string",(allocator *)&gtest_ar_5);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[4]>(&local_58,(char (*) [4])"{?}");
      std::__cxx11::string::~string((string *)&local_58);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [95])
               "Expected: format(\"{?}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)format_str);
  }
  testing::Message::Message((Message *)format_str);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x306,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)format_str);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)format_str);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)format_str,"invalid format string",(allocator *)&gtest_ar_5);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[3]>(&local_78,(char (*) [3])"{0");
      std::__cxx11::string::~string((string *)&local_78);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [94])
               "Expected: format(\"{0\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)format_str);
  }
  testing::Message::Message((Message *)format_str);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x307,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)format_str);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)format_str);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)format_str,"argument index out of range",(allocator *)&gtest_ar_5);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[4]>(&local_98,(char (*) [4])0x1f0c7c);
      std::__cxx11::string::~string((string *)&local_98);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [95])
               "Expected: format(\"{0}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)format_str);
  }
  testing::Message::Message((Message *)format_str);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args = (int *)0x308;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x308,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)format_str);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)format_str);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)format_str,"invalid format string",(allocator *)&gtest_ar_5);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      gtest_ar_5.success_ = true;
      gtest_ar_5._1_3_ = 0;
      fmt::v5::format<char[5],int>(&local_b8,(v5 *)"{00}",&gtest_ar_5.success_,args);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [100])
               "Expected: format(\"{00}\", 42) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)format_str);
  }
  testing::Message::Message((Message *)format_str);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x309,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)format_str);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)format_str);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  safe_sprintf<256ul>(&format_str,"{%u",0x7fffffff);
  testing::AssertionSuccess();
  if (gtest_ar_5.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_ar,"invalid format string",(allocator *)&local_260);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[256]>(&local_d8,&format_str);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_5,
               (char (*) [100])
               "Expected: format(format_str) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_5.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_260,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x30d,pcVar2);
  testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_260);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  safe_sprintf<256ul>(&format_str,"{%u}",0x7fffffff);
  testing::AssertionSuccess();
  if (gtest_ar_5.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_ar,"argument index out of range",(allocator *)&local_260);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[256]>(&local_f8,&format_str);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_5,
               (char (*) [100])
               "Expected: format(format_str) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_5.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_260,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x310,pcVar2);
  testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_260);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  safe_sprintf<256ul>(&format_str,"{%u",0x80000000);
  testing::AssertionSuccess();
  if (gtest_ar_5.success_ == true) {
    std::__cxx11::string::string((string *)&gtest_ar,"number is too big",(allocator *)&local_260);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[256]>(&local_118,&format_str);
      std::__cxx11::string::~string((string *)&local_118);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_5,
               (char (*) [100])
               "Expected: format(format_str) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_5.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_260,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x313,pcVar2);
  testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_260);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  safe_sprintf<256ul>(&format_str,"{%u}",0x80000000);
  testing::AssertionSuccess();
  if (gtest_ar_5.success_ == true) {
    std::__cxx11::string::string((string *)&gtest_ar,"number is too big",(allocator *)&local_260);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[256]>(&local_138,&format_str);
      std::__cxx11::string::~string((string *)&local_138);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_5,
               (char (*) [100])
               "Expected: format(format_str) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_5.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_260,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x315,pcVar2);
  testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_260);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  return;
}

Assistant:

TEST(FormatterTest, ArgErrors) {
  EXPECT_THROW_MSG(format("{"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{?}"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0}"), format_error, "argument index out of range");
  EXPECT_THROW_MSG(format("{00}", 42), format_error, "invalid format string");

  char format_str[BUFFER_SIZE];
  safe_sprintf(format_str, "{%u", INT_MAX);
  EXPECT_THROW_MSG(format(format_str), format_error, "invalid format string");
  safe_sprintf(format_str, "{%u}", INT_MAX);
  EXPECT_THROW_MSG(format(format_str), format_error,
      "argument index out of range");

  safe_sprintf(format_str, "{%u", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str), format_error, "number is too big");
  safe_sprintf(format_str, "{%u}", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str), format_error, "number is too big");
}